

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zvgtweak.c
# Opt level: O1

void init_zvgtweak(void)

{
  initscr();
  start_color();
  cbreak();
  noecho();
  nonl();
  intrflush(_stdscr,0);
  keypad(_stdscr,1);
  init_pair(1,6,4);
  init_pair(2,3,0);
  init_pair(3,0,1);
  nodelay(_stdscr,1);
  return;
}

Assistant:

void init_zvgtweak( void)
{
	initscr();	// clear window
	start_color();
	cbreak();
	noecho();
	nonl();
	intrflush( stdscr, FALSE);
	keypad( stdscr, TRUE);
	
	init_pair( DEF_PAIR, COLOR_CYAN, COLOR_BLUE);
	init_pair( SEL_PAIR, COLOR_YELLOW, COLOR_BLACK);
	init_pair( MSG_PAIR, COLOR_BLACK, COLOR_RED);

	nodelay( stdscr, TRUE);
}